

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O3

void qDrawBorderPixmap(QPainter *painter,QRect *targetRect,QMargins *targetMargins,QPixmap *pixmap,
                      QRect *sourceRect,QMargins *sourceMargins,QTileRules *rules,DrawingHints hints
                      )

{
  uint uVar1;
  undefined1 **ppuVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined1 *puVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  uint uVar16;
  QVLABase<QPainter::PixmapFragment> *pQVar17;
  void *pvVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long *plVar23;
  ulong uVar24;
  QVLABase<QPainter::PixmapFragment> *pQVar25;
  uint uVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  QVLABase<QPainter::PixmapFragment> *pQVar30;
  int i;
  ulong uVar31;
  ulong uVar32;
  uint uVar33;
  qreal *pqVar34;
  PixmapFragment *pPVar35;
  char cVar36;
  PixmapFragment *pPVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  undefined1 *array;
  int iVar41;
  ulong uVar42;
  long in_FS_OFFSET;
  bool bVar43;
  byte bVar44;
  uint uVar45;
  uint uVar49;
  double dVar46;
  undefined1 *puVar47;
  undefined1 auVar48 [16];
  int iVar50;
  int iVar54;
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  int iVar55;
  int iVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 local_c38 [40];
  undefined8 uStack_c10;
  undefined1 local_c08 [12];
  undefined4 uStack_bfc;
  qreal local_bf8;
  qreal qStack_bf0;
  QVLABase<double> local_be8;
  undefined1 *local_bd0;
  undefined1 *puStack_bc8;
  undefined1 *local_bc0;
  undefined1 *puStack_bb8;
  undefined1 *local_bb0;
  undefined1 *puStack_ba8;
  undefined1 *local_ba0;
  undefined1 *puStack_b98;
  undefined1 *local_b90;
  undefined1 *puStack_b88;
  undefined1 *local_b80;
  undefined1 *puStack_b78;
  undefined1 *local_b70;
  undefined1 *puStack_b68;
  undefined1 *local_b60;
  undefined1 *puStack_b58;
  QVLABase<double> local_b50;
  undefined1 *local_b38;
  undefined1 *puStack_b30;
  undefined1 *local_b28;
  undefined1 *puStack_b20;
  undefined1 *local_b18;
  undefined1 *puStack_b10;
  undefined1 *local_b08;
  undefined1 *puStack_b00;
  undefined1 *local_af8;
  undefined1 *puStack_af0;
  undefined1 *local_ae8;
  undefined1 *puStack_ae0;
  undefined1 *local_ad8;
  undefined1 *puStack_ad0;
  undefined1 *local_ac8;
  undefined1 *puStack_ac0;
  QVLABase<QPainter::PixmapFragment> local_ab8;
  undefined1 local_aa0 [1280];
  QVLABase<QPainter::PixmapFragment> local_5a0;
  undefined1 local_588 [1280];
  PixmapFragment local_88;
  long local_38;
  
  bVar44 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_bf8 = 0.0;
  qStack_bf0 = 1.0;
  local_5a0.super_QVLABaseBase.ptr = local_588;
  local_5a0.super_QVLABaseBase.a = 0x10;
  local_5a0.super_QVLABaseBase.s = 0;
  local_ab8.super_QVLABaseBase.ptr = local_aa0;
  local_ab8.super_QVLABaseBase.a = 0x10;
  local_ab8.super_QVLABaseBase.s = 0;
  uVar3 = sourceRect->x1;
  uVar11 = sourceRect->y1;
  uVar4 = sourceMargins->m_left;
  uVar12 = sourceMargins->m_top;
  iVar50 = uVar4 + uVar3;
  iVar54 = uVar12 + uVar11;
  uVar5 = sourceRect->x2;
  uVar13 = sourceRect->y2;
  uVar6 = sourceMargins->m_right;
  uVar14 = sourceMargins->m_bottom;
  iVar55 = (uVar5 - uVar6) + 1;
  iVar56 = (uVar13 - uVar14) + 1;
  uVar45 = iVar55 - iVar50;
  uVar49 = iVar56 - iVar54;
  iVar38 = (targetMargins->m_left).m_i + (targetRect->x1).m_i;
  uVar26 = 3;
  uVar29 = 3;
  iVar41 = (targetMargins->m_top).m_i + (targetRect->y1).m_i;
  local_b50.super_QVLABaseBase.ptr = &local_b38;
  local_b50.super_QVLABaseBase.a = 0x10;
  local_be8.super_QVLABaseBase.ptr = &local_bd0;
  local_be8.super_QVLABaseBase.a = 0x10;
  local_b50.super_QVLABaseBase.s = 0;
  local_be8.super_QVLABaseBase.s = 0;
  iVar39 = ((targetRect->y2).m_i - (targetMargins->m_bottom).m_i) + 1;
  iVar40 = ((targetRect->x2).m_i - (targetMargins->m_right).m_i) + 1;
  iVar19 = iVar40 - iVar38;
  if ((rules->horizontal != StretchTile) && (uVar29 = 3, (bool)(~(iVar55 == iVar50) & 1))) {
    dVar46 = ceil((double)iVar19 / (double)(int)uVar45);
    iVar20 = 1;
    if (1 < (int)dVar46) {
      iVar20 = (int)dVar46;
    }
    uVar29 = iVar20 + 2;
  }
  iVar20 = iVar39 - iVar41;
  if ((rules->vertical != StretchTile) && (iVar56 != iVar54)) {
    dVar46 = ceil((double)iVar20 / (double)(int)uVar49);
    iVar22 = 1;
    if (1 < (int)dVar46) {
      iVar22 = (int)dVar46;
    }
    uVar26 = iVar22 + 2;
  }
  local_c08._8_4_ = 0xffffffff;
  local_c08._0_8_ = 0xffffffffffffffff;
  uStack_bfc = 0xffffffff;
  uStack_c10._0_4_ = 0xffffffff;
  local_c38._32_8_ = 0xffffffffffffffff;
  uStack_c10._4_4_ = 0xffffffff;
  local_c38._16_8_ = -NAN;
  local_c38._24_8_ = -NAN;
  local_c38._0_8_ = -NAN;
  local_c38._8_8_ = -NAN;
  memset(local_588,0xaa,0x500);
  memset(local_aa0,0xaa,0x500);
  local_b38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b30 = &DAT_aaaaaaaaaaaaaaaa;
  local_b28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b20 = &DAT_aaaaaaaaaaaaaaaa;
  local_b18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b10 = &DAT_aaaaaaaaaaaaaaaa;
  local_b08 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b00 = &DAT_aaaaaaaaaaaaaaaa;
  local_af8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_af0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ae8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ae0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ad8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ad0 = &DAT_aaaaaaaaaaaaaaaa;
  local_ac8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ac0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b58 = &DAT_aaaaaaaaaaaaaaaa;
  local_b70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b68 = &DAT_aaaaaaaaaaaaaaaa;
  local_b80 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b78 = &DAT_aaaaaaaaaaaaaaaa;
  local_b90 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b88 = &DAT_aaaaaaaaaaaaaaaa;
  local_ba0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b98 = &DAT_aaaaaaaaaaaaaaaa;
  local_bb0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_ba8 = &DAT_aaaaaaaaaaaaaaaa;
  local_bc0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_bb8 = &DAT_aaaaaaaaaaaaaaaa;
  local_bd0 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_bc8 = &DAT_aaaaaaaaaaaaaaaa;
  uVar42 = (ulong)(uVar29 + 1);
  uVar24 = 0x10;
  if (0x10 < uVar42) {
    uVar24 = uVar42;
  }
  QVLABase<double>::reallocate_impl(&local_b50,0x10,&local_b38,uVar42,uVar24);
  uVar28 = (ulong)(uVar26 + 1);
  uVar24 = local_be8.super_QVLABaseBase.a;
  if (local_be8.super_QVLABaseBase.a <= (long)uVar28) {
    uVar24 = uVar28;
  }
  local_b50.super_QVLABaseBase.s = uVar42;
  QVLABase<double>::reallocate_impl(&local_be8,0x10,&local_bd0,uVar28,uVar24);
  local_be8.super_QVLABaseBase.s = uVar28;
  uVar21 = QPainter::renderHints();
  plVar23 = (long *)QPainter::paintEngine();
  iVar22 = (**(code **)(*plVar23 + 0xa8))(plVar23);
  if (iVar22 != 6) {
    plVar23 = (long *)QPainter::paintEngine();
    iVar22 = (**(code **)(*plVar23 + 0xa8))(plVar23);
    if (((uVar21 & 1) != 0) && (iVar22 != 0xd)) {
      QPainter::combinedTransform();
      iVar22 = QTransform::type();
      if (iVar22 != 0) {
        QPainter::setRenderHint((RenderHint)painter,true);
      }
    }
  }
  pvVar18 = local_b50.super_QVLABaseBase.ptr;
  dVar46 = (double)iVar19;
  iVar22 = (targetRect->x1).m_i;
  *(undefined1 **)local_b50.super_QVLABaseBase.ptr = (undefined1 *)(double)iVar22;
  *(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + 8) = (undefined1 *)(double)iVar38;
  uVar1 = uVar29 - 1;
  uVar42 = (ulong)uVar1;
  *(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8) =
       (undefined1 *)(double)iVar40;
  *(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) =
       (undefined1 *)(double)(((iVar22 + (targetRect->x2).m_i) - (targetRect->x1).m_i) + 1);
  iVar38 = (targetRect->y1).m_i;
  *(undefined1 **)local_be8.super_QVLABaseBase.ptr = (undefined1 *)(double)iVar38;
  *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) = (undefined1 *)(double)iVar41;
  uVar33 = uVar26 - 1;
  uVar24 = (ulong)uVar33;
  *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8) =
       (undefined1 *)(double)iVar39;
  *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) =
       (undefined1 *)(double)(((iVar38 + (targetRect->y2).m_i) - (targetRect->y1).m_i) + 1);
  if (rules->horizontal == RoundTile) {
    dVar46 = dVar46 / (double)(int)(uVar29 - 2);
  }
  else if (rules->horizontal == RepeatTile) {
    dVar46 = (double)(int)uVar45;
  }
  if (3 < uVar29) {
    puVar47 = *(undefined1 **)((long)pvVar18 + 8);
    uVar28 = 2;
    do {
      puVar47 = (undefined1 *)((double)puVar47 + dVar46);
      *(undefined1 **)((long)pvVar18 + uVar28 * 8) = puVar47;
      uVar28 = uVar28 + 1;
    } while (uVar42 != uVar28);
  }
  if (rules->vertical == RepeatTile) {
    dVar51 = (double)(int)uVar49;
  }
  else {
    dVar51 = (double)iVar20;
    if (rules->vertical == RoundTile) {
      dVar51 = dVar51 / (double)(int)(uVar26 - 2);
    }
  }
  if (3 < (int)uVar26) {
    puVar47 = *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8);
    uVar28 = 2;
    do {
      puVar47 = (undefined1 *)((double)puVar47 + dVar51);
      *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar28 * 8) = puVar47;
      uVar28 = uVar28 + 1;
    } while (uVar24 != uVar28);
  }
  if (0 < (targetMargins->m_top).m_i) {
    if (0 < (targetMargins->m_left).m_i) {
      iVar38 = (sourceMargins->m_top).m_i;
      if ((0 < iVar38) && (iVar39 = (sourceMargins->m_left).m_i, 0 < iVar39)) {
        local_c38._0_8_ = ((double)*(undefined1 **)((long)pvVar18 + 8) + (double)*pvVar18) * 0.5;
        local_c38._8_8_ =
             ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) +
             (double)*local_be8.super_QVLABaseBase.ptr) * 0.5;
        uVar7 = sourceRect->x1;
        uVar15 = sourceRect->y1;
        local_c38._16_8_ = (double)(int)uVar7;
        local_c38._24_8_ = (double)(int)uVar15;
        local_c38._32_8_ = (undefined8)iVar39;
        uStack_c10 = (double)iVar38;
        stack0xfffffffffffff400 =
             ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) -
             (double)*local_be8.super_QVLABaseBase.ptr) / uStack_c10;
        local_c08._0_8_ =
             ((double)*(undefined1 **)((long)pvVar18 + 8) - (double)*pvVar18) /
             (double)local_c38._32_8_;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 1) == 0) {
          if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
            pQVar30 = &local_ab8;
            puVar47 = local_aa0;
LAB_00340963:
            QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                      (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
            goto LAB_0034097b;
          }
          pqVar34 = (qreal *)local_c38;
          pPVar35 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar35->x = *pqVar34;
            pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
          }
          pQVar30 = &local_ab8;
          puVar47 = local_aa0;
        }
        else {
          if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
            pQVar30 = &local_5a0;
            puVar47 = local_588;
            goto LAB_00340963;
          }
          pqVar34 = (qreal *)local_c38;
          pPVar35 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar35->x = *pqVar34;
            pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
          }
          pQVar30 = &local_5a0;
          puVar47 = local_588;
        }
        QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                  (pQVar30,0x10,puVar47,&local_88);
      }
LAB_0034097b:
      if ((targetMargins->m_top).m_i < 1) goto LAB_00340b44;
    }
    if (((0 < (targetMargins->m_right).m_i) && (iVar38 = (sourceMargins->m_top).m_i, 0 < iVar38)) &&
       (iVar39 = (sourceMargins->m_right).m_i, 0 < iVar39)) {
      local_c38._0_8_ =
           ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) +
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8)) * 0.5;
      local_c38._8_8_ =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) +
           (double)*local_be8.super_QVLABaseBase.ptr) * 0.5;
      local_c38._16_8_ = (double)iVar55;
      local_c38._24_8_ = (double)(sourceRect->y1).m_i;
      local_c38._32_8_ = (undefined8)iVar39;
      uStack_c10 = (double)iVar38;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) -
           (double)*local_be8.super_QVLABaseBase.ptr) / uStack_c10;
      local_c08._0_8_ =
           ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) -
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8)) /
           (double)local_c38._32_8_;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 4) == 0) {
        if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
          pQVar30 = &local_ab8;
          puVar47 = local_aa0;
LAB_00340b2c:
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
          goto LAB_00340b44;
        }
        pqVar34 = (qreal *)local_c38;
        pPVar35 = &local_88;
        for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
          pPVar35->x = *pqVar34;
          pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
          pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
        }
        pQVar30 = &local_ab8;
        puVar47 = local_aa0;
      }
      else {
        if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
          pQVar30 = &local_5a0;
          puVar47 = local_588;
          goto LAB_00340b2c;
        }
        pqVar34 = (qreal *)local_c38;
        pPVar35 = &local_88;
        for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
          pPVar35->x = *pqVar34;
          pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
          pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
        }
        pQVar30 = &local_5a0;
        puVar47 = local_588;
      }
      QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                (pQVar30,0x10,puVar47,&local_88);
    }
  }
LAB_00340b44:
  if ((targetMargins->m_bottom).m_i < 1) goto LAB_00340ed6;
  if (0 < (targetMargins->m_left).m_i) {
    iVar38 = (sourceMargins->m_bottom).m_i;
    if ((0 < iVar38) && (iVar39 = (sourceMargins->m_left).m_i, 0 < iVar39)) {
      local_c38._0_8_ =
           ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + 8) +
           (double)*local_b50.super_QVLABaseBase.ptr) * 0.5;
      local_c38._8_8_ =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) +
           (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) * 0.5;
      local_c38._16_8_ = (double)(sourceRect->x1).m_i;
      local_c38._24_8_ = (double)iVar56;
      local_c38._32_8_ = (undefined8)iVar39;
      uStack_c10 = (double)iVar38;
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) -
           (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) /
           uStack_c10;
      local_c08._0_8_ =
           ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + 8) -
           (double)*local_b50.super_QVLABaseBase.ptr) / (double)local_c38._32_8_;
      if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                 super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x40) == 0) {
        if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
          pQVar30 = &local_ab8;
          puVar47 = local_aa0;
LAB_00340cf7:
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
          goto LAB_00340d0f;
        }
        pqVar34 = (qreal *)local_c38;
        pPVar35 = &local_88;
        for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
          pPVar35->x = *pqVar34;
          pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
          pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
        }
        pQVar30 = &local_ab8;
        puVar47 = local_aa0;
      }
      else {
        if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
          pQVar30 = &local_5a0;
          puVar47 = local_588;
          goto LAB_00340cf7;
        }
        pqVar34 = (qreal *)local_c38;
        pPVar35 = &local_88;
        for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
          pPVar35->x = *pqVar34;
          pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
          pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
        }
        pQVar30 = &local_5a0;
        puVar47 = local_588;
      }
      QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                (pQVar30,0x10,puVar47,&local_88);
    }
LAB_00340d0f:
    if ((targetMargins->m_bottom).m_i < 1) goto LAB_00340ed6;
  }
  if ((((targetMargins->m_right).m_i < 1) || (iVar38 = (sourceMargins->m_bottom).m_i, iVar38 < 1))
     || (iVar39 = (sourceMargins->m_right).m_i, iVar39 < 1)) goto LAB_00340ed6;
  local_c38._0_8_ =
       ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) +
       (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8)) * 0.5;
  local_c38._8_8_ =
       ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) +
       (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) * 0.5;
  local_c38._16_8_ = (double)iVar55;
  local_c38._24_8_ = (double)iVar56;
  local_c38._32_8_ = (undefined8)iVar39;
  uStack_c10 = (double)iVar38;
  stack0xfffffffffffff400 =
       ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) -
       (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) / uStack_c10;
  local_c08._0_8_ =
       ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) -
       (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8)) /
       (double)local_c38._32_8_;
  if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
             super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i >> 8 & 1) == 0) {
    if (local_ab8.super_QVLABaseBase.s != local_ab8.super_QVLABaseBase.a) {
      pQVar30 = &local_ab8;
      puVar47 = local_aa0;
LAB_00340ebe:
      QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
      goto LAB_00340ed6;
    }
    pqVar34 = (qreal *)local_c38;
    pPVar35 = &local_88;
    for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
      pPVar35->x = *pqVar34;
      pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
      pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
    }
    pQVar30 = &local_ab8;
    puVar47 = local_aa0;
  }
  else {
    if (local_5a0.super_QVLABaseBase.s != local_5a0.super_QVLABaseBase.a) {
      pQVar30 = &local_5a0;
      puVar47 = local_588;
      goto LAB_00340ebe;
    }
    pqVar34 = (qreal *)local_c38;
    pPVar35 = &local_88;
    for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
      pPVar35->x = *pqVar34;
      pqVar34 = pqVar34 + (ulong)bVar44 * -2 + 1;
      pPVar35 = (PixmapFragment *)((long)pPVar35 + ((ulong)bVar44 * -2 + 1) * 8);
    }
    pQVar30 = &local_5a0;
    puVar47 = local_588;
  }
  QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
            (pQVar30,0x10,puVar47,&local_88);
LAB_00340ed6:
  if ((0 < iVar19) && (0 < (int)uVar45)) {
    if ((0 < (targetMargins->m_top).m_i) && (iVar38 = (sourceMargins->m_top).m_i, 0 < iVar38)) {
      bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0;
      pQVar30 = &local_5a0;
      if (bVar43) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar50;
      local_c38._24_8_ = (double)(sourceRect->y1).m_i;
      uStack_c10 = (double)iVar38;
      local_c38._32_8_ = (double)(int)uVar45;
      local_c38._8_8_ =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) +
           (double)*local_be8.super_QVLABaseBase.ptr) * 0.5;
      puVar47 = local_588;
      if (bVar43) {
        puVar47 = local_aa0;
      }
      uVar28 = 2;
      if (2 < (int)uVar1) {
        uVar28 = (ulong)uVar1;
      }
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + 8) -
           (double)*local_be8.super_QVLABaseBase.ptr) / uStack_c10;
      local_c08._0_8_ = dVar46 / (double)(int)uVar45;
      uVar31 = 1;
      do {
        pQVar25 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0) {
          pQVar25 = &local_ab8;
        }
        local_c38._0_8_ =
             ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (uVar31 + 1) * 8) +
             (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar31 * 8)) * 0.5;
        if ((pQVar25->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar44 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar44 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar47,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
        }
        uVar31 = uVar31 + 1;
      } while (uVar28 != uVar31);
      if (rules->horizontal == RepeatTile) {
        bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 2) == 0;
        pQVar30 = &local_5a0;
        if (bVar43) {
          pQVar30 = &local_ab8;
        }
        pQVar25 = &local_5a0;
        if (bVar43) {
          pQVar25 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar25->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x30)
             = ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8) -
               (double)*(undefined1 **)
                        ((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar29 - 2) * 8)) /
               (double)local_c08._0_8_;
      }
    }
    if ((0 < (targetMargins->m_bottom).m_i) && (iVar38 = (sourceMargins->m_bottom).m_i, 0 < iVar38))
    {
      cVar36 = (char)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                     super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i;
      pQVar30 = &local_5a0;
      if (-1 < cVar36) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar50;
      local_c38._24_8_ = (double)iVar56;
      uStack_c10 = (double)iVar38;
      local_c38._32_8_ = (double)(int)uVar45;
      local_c38._8_8_ =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) +
           (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) * 0.5;
      puVar47 = local_588;
      if (-1 < cVar36) {
        puVar47 = local_aa0;
      }
      uVar28 = 2;
      if (2 < (int)uVar1) {
        uVar28 = uVar42;
      }
      stack0xfffffffffffff400 =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (ulong)uVar26 * 8) -
           (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8)) /
           uStack_c10;
      local_c08._0_8_ = dVar46 / (double)(int)uVar45;
      uVar31 = 1;
      do {
        pQVar25 = &local_5a0;
        if (-1 < cVar36) {
          pQVar25 = &local_ab8;
        }
        local_c38._0_8_ =
             ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (uVar31 + 1) * 8) +
             (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar31 * 8)) * 0.5;
        if ((pQVar25->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar44 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar44 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar47,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
        }
        uVar31 = uVar31 + 1;
      } while (uVar28 != uVar31);
      if (rules->horizontal == RepeatTile) {
        pQVar30 = &local_5a0;
        if (-1 < cVar36) {
          pQVar30 = &local_ab8;
        }
        pQVar25 = &local_5a0;
        if (-1 < cVar36) {
          pQVar25 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar25->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x30)
             = ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8) -
               (double)*(undefined1 **)
                        ((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar29 - 2) * 8)) /
               (double)local_c08._0_8_;
      }
    }
  }
  if ((0 < iVar20) && (0 < (int)uVar49)) {
    if ((0 < (targetMargins->m_left).m_i) && (uVar16 = (sourceMargins->m_left).m_i, 0 < (int)uVar16)
       ) {
      bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0;
      pQVar30 = &local_5a0;
      if (bVar43) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)(sourceRect->x1).m_i;
      local_c38._24_8_ = (double)iVar54;
      auVar52._4_4_ = 0;
      auVar52._0_4_ = uVar16;
      auVar52._8_4_ = uVar49;
      auVar52._12_4_ = 0;
      local_c38._32_8_ = SUB168(auVar52 | _DAT_00663760,0) - (double)DAT_00663760;
      uStack_c10 = SUB168(auVar52 | _DAT_00663760,8) - DAT_00663760._8_8_;
      local_c38._0_8_ =
           ((double)*local_b50.super_QVLABaseBase.ptr +
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + 8)) * 0.5;
      auVar58._0_8_ =
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + 8) -
           (double)*local_b50.super_QVLABaseBase.ptr;
      auVar58._8_8_ = dVar51;
      _local_c08 = divpd(auVar58,register0x00001240);
      puVar47 = local_588;
      if (bVar43) {
        puVar47 = local_aa0;
      }
      uVar28 = 2;
      if (2 < (int)uVar33) {
        uVar28 = uVar24;
      }
      uVar31 = 1;
      do {
        pQVar25 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0) {
          pQVar25 = &local_ab8;
        }
        local_c38._8_8_ =
             ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (uVar31 + 1) * 8) +
             (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar31 * 8)) * 0.5;
        if ((pQVar25->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar44 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar44 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar47,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
        }
        uVar31 = uVar31 + 1;
      } while (uVar28 != uVar31);
      if (rules->vertical == RepeatTile) {
        bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 8) == 0;
        pQVar30 = &local_5a0;
        if (bVar43) {
          pQVar30 = &local_ab8;
        }
        pQVar25 = &local_5a0;
        if (bVar43) {
          pQVar25 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar25->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x28)
             = ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8) -
               (double)*(undefined1 **)
                        ((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar26 - 2) * 8)) /
               stack0xfffffffffffff400;
      }
    }
    if ((0 < (targetMargins->m_right).m_i) &&
       (uVar16 = (sourceMargins->m_right).m_i, 0 < (int)uVar16)) {
      bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                      super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0;
      pQVar30 = &local_5a0;
      if (bVar43) {
        pQVar30 = &local_ab8;
      }
      local_c38._16_8_ = (double)iVar55;
      local_c38._24_8_ = (double)iVar54;
      auVar53._4_4_ = 0;
      auVar53._0_4_ = uVar16;
      auVar53._8_4_ = uVar49;
      auVar53._12_4_ = 0;
      local_c38._32_8_ = SUB168(auVar53 | _DAT_00663760,0) - (double)DAT_00663760;
      uStack_c10 = SUB168(auVar53 | _DAT_00663760,8) - DAT_00663760._8_8_;
      local_c38._0_8_ =
           ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) +
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8)) * 0.5;
      auVar48._0_8_ =
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (ulong)uVar29 * 8) -
           (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8);
      auVar48._8_8_ = dVar51;
      _local_c08 = divpd(auVar48,register0x00001240);
      puVar47 = local_588;
      if (bVar43) {
        puVar47 = local_aa0;
      }
      uVar28 = 2;
      if (2 < (int)uVar33) {
        uVar28 = uVar24;
      }
      uVar31 = 1;
      do {
        pQVar25 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0) {
          pQVar25 = &local_ab8;
        }
        local_c38._8_8_ =
             ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + (uVar31 + 1) * 8) +
             (double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar31 * 8)) * 0.5;
        if ((pQVar25->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar44 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar44 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,puVar47,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,puVar47,(PixmapFragment *)local_c38);
        }
        uVar31 = uVar31 + 1;
      } while (uVar28 != uVar31);
      if (rules->vertical == RepeatTile) {
        bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x20) == 0;
        pQVar30 = &local_5a0;
        if (bVar43) {
          pQVar30 = &local_ab8;
        }
        pQVar25 = &local_5a0;
        if (bVar43) {
          pQVar25 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar25->super_QVLABaseBase).ptr + (pQVar30->super_QVLABaseBase).s * 0x50 + -0x28)
             = ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8) -
               (double)*(undefined1 **)
                        ((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar26 - 2) * 8)) /
               stack0xfffffffffffff400;
      }
    }
  }
  if ((((0 < iVar20) && (0 < iVar19)) && (0 < (int)uVar45)) && (0 < (int)uVar49)) {
    bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                    super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
    pQVar30 = &local_5a0;
    if (bVar43) {
      pQVar30 = &local_ab8;
    }
    local_c38._16_8_ = (double)iVar50;
    local_c38._24_8_ = (double)iVar54;
    local_c38._32_8_ = (double)((ulong)uVar45 | 0x4330000000000000) - 4503599627370496.0;
    uStack_c10 = (double)((ulong)uVar49 | 0x4330000000000000) - 4503599627370496.0;
    auVar57._8_8_ = dVar51;
    auVar57._0_8_ = dVar46;
    auVar58 = divpd(auVar57,register0x00001240);
    _local_c08 = auVar58;
    puVar47 = *(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar42 * 8);
    puVar8 = *(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + ((ulong)uVar29 - 2) * 8);
    puVar9 = *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8);
    puVar10 = *(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + ((ulong)uVar26 - 2) * 8);
    array = local_588;
    if (bVar43) {
      array = local_aa0;
    }
    uVar28 = 2;
    if (2 < (int)uVar1) {
      uVar28 = uVar42;
    }
    uVar31 = 2;
    if (2 < (int)uVar33) {
      uVar31 = uVar24;
    }
    uVar24 = 1;
    do {
      lVar27 = uVar24 + 1;
      ppuVar2 = (undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + uVar24 * 8);
      uVar24 = uVar24 + 1;
      local_c38._8_8_ =
           ((double)*(undefined1 **)((long)local_be8.super_QVLABaseBase.ptr + lVar27 * 8) +
           (double)*ppuVar2) * 0.5;
      uVar32 = 1;
      do {
        pQVar25 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0) {
          pQVar25 = &local_ab8;
        }
        local_c38._0_8_ =
             ((double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + (uVar32 + 1) * 8) +
             (double)*(undefined1 **)((long)local_b50.super_QVLABaseBase.ptr + uVar32 * 8)) * 0.5;
        if ((pQVar25->super_QVLABaseBase).s == (pQVar30->super_QVLABaseBase).a) {
          pPVar35 = (PixmapFragment *)local_c38;
          pPVar37 = &local_88;
          for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
            pPVar37->x = pPVar35->x;
            pPVar35 = (PixmapFragment *)((long)pPVar35 + (ulong)bVar44 * -0x10 + 8);
            pPVar37 = (PixmapFragment *)((long)pPVar37 + (ulong)bVar44 * -0x10 + 8);
          }
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment>
                    (pQVar30,0x10,array,&local_88);
        }
        else {
          QVLABase<QPainter::PixmapFragment>::emplace_back_impl<QPainter::PixmapFragment_const&>
                    (pQVar30,0x10,array,(PixmapFragment *)local_c38);
        }
        uVar32 = uVar32 + 1;
      } while (uVar28 != uVar32);
      if (rules->horizontal == RepeatTile) {
        bVar43 = ((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                        super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0;
        pQVar25 = &local_5a0;
        if (bVar43) {
          pQVar25 = &local_ab8;
        }
        pQVar17 = &local_5a0;
        if (bVar43) {
          pQVar17 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar17->super_QVLABaseBase).ptr + (pQVar25->super_QVLABaseBase).s * 0x50 + -0x30)
             = ((double)puVar47 - (double)puVar8) / auVar58._0_8_;
      }
    } while (uVar24 != uVar31);
    if (rules->vertical == RepeatTile) {
      uVar24 = 2;
      if (2 < (int)uVar1) {
        uVar24 = uVar42;
      }
      lVar27 = -1;
      do {
        pQVar30 = &local_5a0;
        pQVar25 = &local_5a0;
        if (((uint)hints.super_QFlagsStorageHelper<QDrawBorderPixmap::DrawingHint,_4>.
                   super_QFlagsStorage<QDrawBorderPixmap::DrawingHint>.i & 0x10) == 0) {
          pQVar30 = &local_ab8;
          pQVar25 = &local_ab8;
        }
        *(double *)
         ((long)(pQVar30->super_QVLABaseBase).ptr +
         ((pQVar25->super_QVLABaseBase).s + lVar27) * 0x50 + 0x28) =
             ((double)puVar9 - (double)puVar10) / auVar58._8_8_;
        lVar27 = lVar27 + -1;
      } while (-lVar27 != uVar24);
    }
  }
  if (local_5a0.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_5a0.super_QVLABaseBase.ptr,local_5a0.super_QVLABaseBase.s,pixmap,1);
  }
  if (local_ab8.super_QVLABaseBase.s != 0) {
    QPainter::drawPixmapFragments
              (painter,local_ab8.super_QVLABaseBase.ptr,local_ab8.super_QVLABaseBase.s,pixmap,0);
  }
  if ((uVar21 & 1) != 0) {
    QPainter::setRenderHint((RenderHint)painter,true);
  }
  if ((undefined1 **)local_be8.super_QVLABaseBase.ptr != &local_bd0) {
    QtPrivate::sizedFree(local_be8.super_QVLABaseBase.ptr,local_be8.super_QVLABaseBase.a << 3);
  }
  if ((undefined1 **)local_b50.super_QVLABaseBase.ptr != &local_b38) {
    QtPrivate::sizedFree(local_b50.super_QVLABaseBase.ptr,local_b50.super_QVLABaseBase.a << 3);
  }
  if ((undefined1 *)local_ab8.super_QVLABaseBase.ptr != local_aa0) {
    QtPrivate::sizedFree(local_ab8.super_QVLABaseBase.ptr,local_ab8.super_QVLABaseBase.a * 0x50);
  }
  if ((undefined1 *)local_5a0.super_QVLABaseBase.ptr != local_588) {
    QtPrivate::sizedFree(local_5a0.super_QVLABaseBase.ptr,local_5a0.super_QVLABaseBase.a * 0x50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qDrawBorderPixmap(QPainter *painter, const QRect &targetRect, const QMargins &targetMargins,
                       const QPixmap &pixmap, const QRect &sourceRect,const QMargins &sourceMargins,
                       const QTileRules &rules
#ifndef Q_QDOC
                       , QDrawBorderPixmap::DrawingHints hints
#endif
                       )
{
    QPainter::PixmapFragment d;
    d.opacity = 1.0;
    d.rotation = 0.0;

    QPixmapFragmentsArray opaqueData;
    QPixmapFragmentsArray translucentData;

    // source center
    const int sourceCenterTop = sourceRect.top() + sourceMargins.top();
    const int sourceCenterLeft = sourceRect.left() + sourceMargins.left();
    const int sourceCenterBottom = sourceRect.bottom() - sourceMargins.bottom() + 1;
    const int sourceCenterRight = sourceRect.right() - sourceMargins.right() + 1;
    const int sourceCenterWidth = sourceCenterRight - sourceCenterLeft;
    const int sourceCenterHeight = sourceCenterBottom - sourceCenterTop;
    // target center
    const int targetCenterTop = targetRect.top() + targetMargins.top();
    const int targetCenterLeft = targetRect.left() + targetMargins.left();
    const int targetCenterBottom = targetRect.bottom() - targetMargins.bottom() + 1;
    const int targetCenterRight = targetRect.right() - targetMargins.right() + 1;
    const int targetCenterWidth = targetCenterRight - targetCenterLeft;
    const int targetCenterHeight = targetCenterBottom - targetCenterTop;

    QVarLengthArray<qreal, 16> xTarget; // x-coordinates of target rectangles
    QVarLengthArray<qreal, 16> yTarget; // y-coordinates of target rectangles

    int columns = 3;
    int rows = 3;
    if (rules.horizontal != Qt::StretchTile && sourceCenterWidth != 0)
        columns = qMax(3, 2 + qCeil(targetCenterWidth / qreal(sourceCenterWidth)));
    if (rules.vertical != Qt::StretchTile && sourceCenterHeight != 0)
        rows = qMax(3, 2 + qCeil(targetCenterHeight / qreal(sourceCenterHeight)));

    xTarget.resize(columns + 1);
    yTarget.resize(rows + 1);

    bool oldAA = painter->testRenderHint(QPainter::Antialiasing);
    if (painter->paintEngine()->type() != QPaintEngine::OpenGL
        && painter->paintEngine()->type() != QPaintEngine::OpenGL2
        && oldAA && painter->combinedTransform().type() != QTransform::TxNone) {
        painter->setRenderHint(QPainter::Antialiasing, false);
    }

    xTarget[0] = targetRect.left();
    xTarget[1] = targetCenterLeft;
    xTarget[columns - 1] = targetCenterRight;
    xTarget[columns] = targetRect.left() + targetRect.width();

    yTarget[0] = targetRect.top();
    yTarget[1] = targetCenterTop;
    yTarget[rows - 1] = targetCenterBottom;
    yTarget[rows] = targetRect.top() + targetRect.height();

    qreal dx = targetCenterWidth;
    qreal dy = targetCenterHeight;

    switch (rules.horizontal) {
    case Qt::StretchTile:
        dx = targetCenterWidth;
        break;
    case Qt::RepeatTile:
        dx = sourceCenterWidth;
        break;
    case Qt::RoundTile:
        dx = targetCenterWidth / qreal(columns - 2);
        break;
    }

    for (int i = 2; i < columns - 1; ++i)
        xTarget[i] = xTarget[i - 1] + dx;

    switch (rules.vertical) {
    case Qt::StretchTile:
        dy = targetCenterHeight;
        break;
    case Qt::RepeatTile:
        dy = sourceCenterHeight;
        break;
    case Qt::RoundTile:
        dy = targetCenterHeight / qreal(rows - 2);
        break;
    }

    for (int i = 2; i < rows - 1; ++i)
        yTarget[i] = yTarget[i - 1] + dy;

    // corners
    if (targetMargins.top() > 0 && targetMargins.left() > 0 && sourceMargins.top() > 0 && sourceMargins.left() > 0) { // top left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.left();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.top() > 0 && targetMargins.right() > 0 && sourceMargins.top() > 0 && sourceMargins.right() > 0) { // top right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[1] + yTarget[0]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceRect.top();
        d.width = sourceMargins.right();
        d.height = sourceMargins.top();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueTopRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.left() > 0 && sourceMargins.bottom() > 0 && sourceMargins.left() > 0) { // bottom left
        d.x = (0.5 * (xTarget[1] + xTarget[0]));
        d.y =(0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceRect.left();
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.left();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomLeft)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }
    if (targetMargins.bottom() > 0 && targetMargins.right() > 0 && sourceMargins.bottom() > 0 && sourceMargins.right() > 0) { // bottom right
        d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
        d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
        d.sourceLeft = sourceCenterRight;
        d.sourceTop = sourceCenterBottom;
        d.width = sourceMargins.right();
        d.height = sourceMargins.bottom();
        d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
        d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
        if (hints & QDrawBorderPixmap::OpaqueBottomRight)
            opaqueData.append(d);
        else
            translucentData.append(d);
    }

    // horizontal edges
    if (targetCenterWidth > 0 && sourceCenterWidth > 0) {
        if (targetMargins.top() > 0 && sourceMargins.top() > 0) { // top
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueTop ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceRect.top();
            d.width = sourceCenterWidth;
            d.height = sourceMargins.top();
            d.y = (0.5 * (yTarget[1] + yTarget[0]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[1] - yTarget[0]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
        if (targetMargins.bottom() > 0 && sourceMargins.bottom() > 0) { // bottom
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueBottom ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterLeft;
            d.sourceTop = sourceCenterBottom;
            d.width = sourceCenterWidth;
            d.height = sourceMargins.bottom();
            d.y = (0.5 * (yTarget[rows] + yTarget[rows - 1]));
            d.scaleX = dx / d.width;
            d.scaleY = qreal(yTarget[rows] - yTarget[rows - 1]) / d.height;
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = ((xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX);
        }
    }

    // vertical edges
    if (targetCenterHeight > 0 && sourceCenterHeight > 0) {
        if (targetMargins.left() > 0 && sourceMargins.left() > 0) { // left
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueLeft ? opaqueData : translucentData;
            d.sourceLeft = sourceRect.left();
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.left();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[1] + xTarget[0]));
            d.scaleX = qreal(xTarget[1] - xTarget[0]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
        if (targetMargins.right() > 0 && sourceMargins.right() > 0) { // right
            QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueRight ? opaqueData : translucentData;
            d.sourceLeft = sourceCenterRight;
            d.sourceTop = sourceCenterTop;
            d.width = sourceMargins.right();
            d.height = sourceCenterHeight;
            d.x = (0.5 * (xTarget[columns] + xTarget[columns - 1]));
            d.scaleX = qreal(xTarget[columns] - xTarget[columns - 1]) / d.width;
            d.scaleY = dy / d.height;
            for (int i = 1; i < rows - 1; ++i) {
                d.y = (0.5 * (yTarget[i + 1] + yTarget[i]));
                data.append(d);
            }
            if (rules.vertical == Qt::RepeatTile)
                data[data.size() - 1].height = ((yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY);
        }
    }

    // center
    if (targetCenterWidth > 0 && targetCenterHeight > 0 && sourceCenterWidth > 0 && sourceCenterHeight > 0) {
        QPixmapFragmentsArray &data = hints & QDrawBorderPixmap::OpaqueCenter ? opaqueData : translucentData;
        d.sourceLeft = sourceCenterLeft;
        d.sourceTop = sourceCenterTop;
        d.width = sourceCenterWidth;
        d.height = sourceCenterHeight;
        d.scaleX = dx / d.width;
        d.scaleY = dy / d.height;

        qreal repeatWidth = (xTarget[columns - 1] - xTarget[columns - 2]) / d.scaleX;
        qreal repeatHeight = (yTarget[rows - 1] - yTarget[rows - 2]) / d.scaleY;

        for (int j = 1; j < rows - 1; ++j) {
            d.y = (0.5 * (yTarget[j + 1] + yTarget[j]));
            for (int i = 1; i < columns - 1; ++i) {
                d.x = (0.5 * (xTarget[i + 1] + xTarget[i]));
                data.append(d);
            }
            if (rules.horizontal == Qt::RepeatTile)
                data[data.size() - 1].width = repeatWidth;
        }
        if (rules.vertical == Qt::RepeatTile) {
            for (int i = 1; i < columns - 1; ++i)
                data[data.size() - i].height = repeatHeight;
        }
    }

    if (opaqueData.size())
        painter->drawPixmapFragments(opaqueData.data(), opaqueData.size(), pixmap, QPainter::OpaqueHint);
    if (translucentData.size())
        painter->drawPixmapFragments(translucentData.data(), translucentData.size(), pixmap);

    if (oldAA)
        painter->setRenderHint(QPainter::Antialiasing, true);
}